

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgifhandler.cpp
# Opt level: O3

ssize_t __thiscall QGifHandler::read(QGifHandler *this,int __fd,void *__buf,size_t __nbytes)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  ssize_t sVar4;
  long *plVar5;
  long lVar6;
  uchar *buffer;
  undefined4 in_register_00000034;
  QGIFFormat *pQVar7;
  long in_FS_OFFSET;
  QArrayData *local_50 [3];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = this->gifFormat;
  bVar1 = pQVar7->newFrame;
  if ((bool)bVar1 == false) {
    do {
      lVar6 = (this->buffer).d.size;
      if (lVar6 == 0) {
        QImageIOHandler::device();
        QIODevice::read((longlong)local_50);
        QByteArray::append(&this->buffer);
        if (local_50[0] != (QArrayData *)0x0) {
          LOCK();
          (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_50[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_50[0],1,0x10);
          }
        }
        pQVar7 = this->gifFormat;
        lVar6 = (this->buffer).d.size;
        if (lVar6 == 0) break;
      }
      buffer = (uchar *)(this->buffer).d.ptr;
      if (buffer == (uchar *)0x0) {
        buffer = (uchar *)&QByteArray::_empty;
      }
      iVar3 = QGIFFormat::decode(pQVar7,&this->lastImage,buffer,(int)lVar6,&this->nextDelay,
                                 &this->loopCnt);
      if (iVar3 == -1) {
        pQVar7 = this->gifFormat;
        break;
      }
      QByteArray::remove((longlong)&this->buffer,0);
      pQVar7 = this->gifFormat;
    } while (pQVar7->newFrame != true);
    bVar1 = pQVar7->newFrame;
  }
  if ((bVar1 & 1) == 0) {
    if (pQVar7->partialNewFrame == true) {
      plVar5 = (long *)QImageIOHandler::device();
      cVar2 = (**(code **)(*plVar5 + 0x90))(plVar5);
      if (cVar2 != '\0') goto LAB_001052e4;
    }
    sVar4 = 0;
  }
  else {
LAB_001052e4:
    QImage::operator=((QImage *)CONCAT44(in_register_00000034,__fd),&this->lastImage);
    this->frameNumber = this->frameNumber + 1;
    pQVar7 = this->gifFormat;
    pQVar7->newFrame = false;
    pQVar7->partialNewFrame = false;
    sVar4 = CONCAT71((int7)((ulong)pQVar7 >> 8),1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return sVar4;
}

Assistant:

bool QGifHandler::read(QImage *image)
{
    const int GifChunkSize = 4096;

    while (!gifFormat->newFrame) {
        if (buffer.isEmpty()) {
            buffer += device()->read(GifChunkSize);
            if (buffer.isEmpty())
                break;
        }

        int decoded = gifFormat->decode(&lastImage, (const uchar *)buffer.constData(), buffer.size(),
                                        &nextDelay, &loopCnt);
        if (decoded == -1)
            break;
        buffer.remove(0, decoded);
    }
    if (gifFormat->newFrame || (gifFormat->partialNewFrame && device()->atEnd())) {
        *image = lastImage;
        ++frameNumber;
        gifFormat->newFrame = false;
        gifFormat->partialNewFrame = false;
        return true;
    }

    return false;
}